

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.h
# Opt level: O0

void celero::DoNotOptimizeAway<unsigned_long>(unsigned_long *x)

{
  bool bVar1;
  int iVar2;
  unsigned_long *p;
  id local_18;
  unsigned_long *local_10;
  unsigned_long *x_local;
  
  local_10 = x;
  if (DoNotOptimizeAway<unsigned_long>(unsigned_long&&)::ttid == '\0') {
    iVar2 = __cxa_guard_acquire(&DoNotOptimizeAway<unsigned_long>(unsigned_long&&)::ttid);
    if (iVar2 != 0) {
      DoNotOptimizeAway<unsigned_long>::ttid = std::this_thread::get_id();
      __cxa_guard_release(&DoNotOptimizeAway<unsigned_long>(unsigned_long&&)::ttid);
    }
  }
  local_18._M_thread = DoNotOptimizeAway<unsigned_long>::ttid._M_thread;
  std::thread::id::id((id *)&p);
  bVar1 = std::operator==(local_18,(id)p);
  if (!bVar1) {
    return;
  }
  putchar((int)(char)*local_10);
  abort();
}

Assistant:

void DoNotOptimizeAway(T&& x)
	{
		static auto ttid = std::this_thread::get_id();
		if(ttid == std::thread::id())
		{
			// This forces the value to never be optimized away
			// by taking a reference then using it.
			const auto* p = &x;
			putchar(*reinterpret_cast<const char*>(p));

			// If we do get here, kick out because something has gone wrong.
			std::abort();
		}
	}